

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O0

XmlNodePtr __thiscall libcellml::XmlNode::firstChild(XmlNode *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined8 *in_RSI;
  XmlNodePtr XVar3;
  byte local_81;
  string local_68;
  undefined1 local_45;
  bool textNode;
  shared_ptr<libcellml::XmlNode> local_38;
  undefined1 local_21;
  xmlNodePtr local_20;
  xmlNodePtr child;
  XmlNode *this_local;
  XmlNodePtr *childHandle;
  
  local_20 = *(xmlNodePtr *)(*(long *)*in_RSI + 0x18);
  local_21 = 0;
  this_local = this;
  std::shared_ptr<libcellml::XmlNode>::shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)this,(nullptr_t)0x0);
  _Var2._M_pi = extraout_RDX;
  for (; local_20 != (xmlNodePtr)0x0; local_20 = local_20->next) {
    std::make_shared<libcellml::XmlNode>();
    std::shared_ptr<libcellml::XmlNode>::operator=((shared_ptr<libcellml::XmlNode> *)this,&local_38)
    ;
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_38);
    peVar1 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    setXmlNode(peVar1,&local_20);
    peVar1 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_45 = isText(peVar1);
    local_81 = 1;
    _Var2._M_pi = extraout_RDX_00;
    if ((bool)local_45) {
      peVar1 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      convertToStrippedString_abi_cxx11_(&local_68,peVar1);
      local_81 = std::__cxx11::string::empty();
      local_81 = local_81 ^ 0xff;
      std::__cxx11::string::~string((string *)&local_68);
      _Var2._M_pi = extraout_RDX_01;
    }
    if ((local_81 & 1) != 0) break;
  }
  XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (XmlNodePtr)XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr XmlNode::firstChild() const
{
    xmlNodePtr child = mPimpl->mXmlNodePtr->children;
    XmlNodePtr childHandle = nullptr;
    while (child != nullptr) {
        childHandle = std::make_shared<XmlNode>();
        childHandle->setXmlNode(child);
        bool textNode = childHandle->isText();
        if (!textNode || !childHandle->convertToStrippedString().empty()) {
            break;
        }
        child = child->next;
    }
    return childHandle;
}